

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::import_csym(compiler_type *this,string *module_path,string *csym_path)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  reference pcVar4;
  string *in_RDX;
  char *ch_1;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string map_str;
  smatch match;
  int ch;
  bool expect_n;
  string buff;
  string header;
  regex reg;
  csym_info csym;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
  *__idx;
  csym_info *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  match_flag_type in_stack_fffffffffffffc0c;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
  *in_stack_fffffffffffffc10;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  flag_type in_stack_fffffffffffffc34;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  string *local_350;
  string local_348 [32];
  string local_328 [64];
  int local_2e8;
  byte local_2e1;
  string local_2e0 [32];
  string local_2c0 [64];
  string local_280 [32];
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
  local_260;
  undefined4 local_230;
  long local_220 [68];
  
  std::ifstream::ifstream(local_220,in_RDX,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_230 = 1;
  }
  else {
    csym_info::csym_info(in_stack_fffffffffffffc00);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc34);
    std::__cxx11::string::string(local_2c0);
    std::__cxx11::string::string(local_2e0);
    local_2e1 = 0;
    local_2e8 = std::istream::get();
    while (bVar2 = std::ios::operator_cast_to_bool
                             ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18))), bVar2) {
      if (((local_2e1 & 1) != 0) && (local_2e1 = 0, local_2e8 != 10)) {
        std::__cxx11::string::operator+=(local_2e0,'\r');
      }
      if (local_2e8 == 10) {
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          std::__cxx11::string::clear();
        }
        else {
          std::swap<char,std::char_traits<char>,std::allocator<char>>
                    (&in_stack_fffffffffffffc00->file,in_stack_fffffffffffffbf8);
        }
      }
      else if (local_2e8 == 0xd) {
        local_2e1 = 1;
      }
      else {
        std::__cxx11::string::operator+=(local_2e0,(char)local_2e8);
      }
      local_2e8 = std::istream::get();
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffc10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)in_stack_fffffffffffffc00);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                       in_stack_fffffffffffffc18,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
    if (bVar2) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
            (size_type)in_stack_fffffffffffffc00);
      std::__cxx11::string::operator=(local_280,local_328);
      std::__cxx11::string::~string(local_328);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
            (size_type)in_stack_fffffffffffffc00);
      local_350 = local_348;
      local_358._M_current = (char *)std::__cxx11::string::begin();
      std::__cxx11::string::end();
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffc00,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)in_stack_fffffffffffffbf8), bVar2) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_358);
        if (*pcVar4 == ',') {
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            bVar2 = std::operator!=(&in_stack_fffffffffffffc00->file,
                                    (char *)in_stack_fffffffffffffbf8);
            if (bVar2) {
              in_stack_fffffffffffffc10 = &local_260;
              std::__cxx11::stoull
                        (&in_stack_fffffffffffffc00->file,(size_t *)in_stack_fffffffffffffbf8,0);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
            }
            else {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
            }
            std::__cxx11::string::clear();
          }
        }
        else {
          std::__cxx11::string::operator+=(local_2e0,*pcVar4);
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_358);
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        bVar2 = std::operator!=(&in_stack_fffffffffffffc00->file,(char *)in_stack_fffffffffffffbf8);
        in_stack_fffffffffffffc0c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc0c);
        if (bVar2) {
          __idx = &local_260;
          in_stack_fffffffffffffc00 =
               (csym_info *)std::__cxx11::stoull(&in_stack_fffffffffffffc00->file,(size_t *)__idx,0)
          ;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc00,(value_type *)__idx);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc00,(value_type *)in_stack_fffffffffffffbf8);
        }
        std::__cxx11::string::clear();
      }
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
      ::
      emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cs::csym_info,_0>
                (in_stack_fffffffffffffc10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 in_stack_fffffffffffffc00);
      std::__cxx11::string::~string(local_348);
      local_230 = 0;
    }
    else {
      local_230 = 1;
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)0x13c06f);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffc00);
    csym_info::~csym_info(in_stack_fffffffffffffc00);
  }
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void compiler_type::import_csym(const std::string &module_path, const std::string &csym_path)
	{
		std::ifstream ifs(csym_path);
		if (!ifs.is_open())
			return;
		csym_info csym;
		std::regex reg("^#\\$cSYM/1\\.0\\(([^\\)]*)\\):(.*)$");
		// Read file
		std::string header, buff;
		bool expect_n = false;
		for (int ch = ifs.get(); ifs; ch = ifs.get()) {
			if (expect_n) {
				expect_n = false;
				if (ch != '\n')
					buff += '\r';
			}
			switch (ch) {
			case '\n':
				if (!header.empty()) {
					csym.codes.emplace_back(buff);
					buff.clear();
				}
				else
					std::swap(header, buff);
				break;
			case '\r':
				expect_n = true;
				break;
			default:
				buff += ch;
				break;
			}
		}
		if (!buff.empty()) {
			csym.codes.emplace_back(buff);
		}
		// Parsing header
		std::smatch match;
		if (!std::regex_match(header, match, reg))
			return;
		csym.file = match.str(1);
		std::string map_str = match.str(2);
		for (auto &ch: map_str) {
			if (ch == ',') {
				if (!buff.empty()) {
					if (buff != "-")
						csym.map.push_back(std::stoull(buff) + 1);
					else
						csym.map.push_back(0);
					buff.clear();
				}
			}
			else
				buff += ch;
		}
		if (!buff.empty()) {
			if (buff != "-")
				csym.map.push_back(std::stoull(buff) + 1);
			else
				csym.map.push_back(0);
			buff.clear();
		}
		csyms.emplace(module_path, std::move(csym));
	}